

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::release_widget_pointer(Fl_Widget **w)

{
  Fl_Widget **ppFVar1;
  Fl_Widget ***pppFVar2;
  ulong uVar3;
  ulong uVar4;
  
  pppFVar2 = widget_watch;
  uVar4 = 0;
  uVar3 = (ulong)(uint)num_widget_watch;
  if (num_widget_watch < 1) {
    uVar3 = uVar4;
  }
  num_widget_watch = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    ppFVar1 = pppFVar2[uVar4];
    if (ppFVar1 != w) {
      if ((long)num_widget_watch < (long)uVar4) {
        pppFVar2[num_widget_watch] = ppFVar1;
      }
      num_widget_watch = num_widget_watch + 1;
    }
  }
  return;
}

Assistant:

void Fl::release_widget_pointer(Fl_Widget *&w)
{
  Fl_Widget **wp = &w;
  int i,j=0;
  for (i=0; i<num_widget_watch; ++i) {
    if (widget_watch[i]!=wp) {
      if (j<i) widget_watch[j] = widget_watch[i]; // fill gap
      j++;
    }
#ifdef DEBUG_WATCH
    else { // found widget pointer
      printf ("release_widget_pointer: (%d/%d) %8p => %8p\n",
	i+1,num_widget_watch,wp,*wp);
    }
#endif //DEBUG_WATCH
  }
  num_widget_watch = j;
#ifdef DEBUG_WATCH
  printf ("                        num_widget_watch = %d\n\n",num_widget_watch);
  fflush(stdout);
#endif // DEBUG_WATCH
  return;
}